

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzintel.cpp
# Opt level: O3

TPZConnect * __thiscall
TPZInterpolatedElement::SideConnect(TPZInterpolatedElement *this,int connect,int side)

{
  TPZCompMesh *pTVar1;
  int iVar2;
  undefined4 uVar3;
  TPZGeoEl *pTVar4;
  int64_t nelem;
  TPZConnect *pTVar5;
  
  if (-1 < (side | connect)) {
    pTVar4 = TPZCompEl::Reference((TPZCompEl *)this);
    iVar2 = (**(code **)(*(long *)pTVar4 + 0xf0))(pTVar4);
    if (side <= iVar2) {
      pTVar1 = (this->super_TPZInterpolationSpace).super_TPZCompEl.fMesh;
      uVar3 = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0x250))
                        (this,connect,side);
      nelem = (**(code **)(*(long *)&(this->super_TPZInterpolationSpace).super_TPZCompEl + 0xa0))
                        (this,uVar3);
      pTVar5 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(pTVar1->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
      return pTVar5;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Exiting SideConnect - has bad first or second parameter.",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  if (SideConnect(int,int)::con == '\0') {
    iVar2 = __cxa_guard_acquire(&SideConnect(int,int)::con);
    if (iVar2 != 0) {
      TPZConnect::TPZConnect(&SideConnect::con);
      __cxa_atexit(TPZConnect::~TPZConnect,&SideConnect::con,&__dso_handle);
      __cxa_guard_release(&SideConnect(int,int)::con);
    }
  }
  return &SideConnect::con;
}

Assistant:

TPZConnect &TPZInterpolatedElement::SideConnect(int connect, int side) {
    if (side < 0 || connect < 0 || side > Reference()->NSides()) {
        LOGPZ_ERROR(logger, "Exiting SideConnect - has bad first or second parameter.");
        static TPZConnect con;
        return con;
    }
    return (fMesh->ConnectVec()[SideConnectIndex(connect, side)]);
}